

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O3

void defyx_release_cache(defyx_cache *cache)

{
  pointer pcVar1;
  pointer puVar2;
  
  (*cache->dealloc)(cache);
  pcVar1 = (cache->cacheKey)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(cache->cacheKey).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (cache->reciprocalCache).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  operator_delete(cache);
  return;
}

Assistant:

void defyx_release_cache(defyx_cache* cache) {
		assert(cache != nullptr);
		cache->dealloc(cache);
		delete cache;
	}